

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
zeGetVirtualMemProcAddrTable(ze_api_version_t version,ze_virtual_mem_dditable_t *pDdiTable)

{
  bool bVar1;
  bool bVar2;
  ze_result_t zVar3;
  size_type sVar4;
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *this;
  reference pdVar5;
  reference pvVar6;
  code *pcVar7;
  ze_memory_access_attribute_t *pzVar8;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t *in_R8;
  undefined1 local_98 [8];
  ze_virtual_mem_dditable_t dditable;
  ze_pfnGetVirtualMemProcAddrTable_t getTable_2;
  ze_pfnGetVirtualMemProcAddrTable_t getTable_1;
  ze_result_t getTableResult;
  ze_pfnGetVirtualMemProcAddrTable_t getTable;
  driver_t *drv;
  iterator __end1;
  iterator __begin1;
  driver_vector_t *__range1;
  bool atLeastOneDriverValid;
  ze_result_t result;
  ze_virtual_mem_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  sVar4 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                    ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                     (loader::context + 0x15e0));
  if (sVar4 == 0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else if (pDdiTable == (ze_virtual_mem_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (*(int *)(loader::context + 0x15c0) < (int)version) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  else {
    bVar1 = false;
    this = (vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)(loader::context + 0x15e0)
    ;
    __end1 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(this);
    drv = (driver_t *)std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(this);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                                       *)&drv), bVar2) {
      pdVar5 = __gnu_cxx::
               __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
               ::operator*(&__end1);
      if ((pdVar5->initStatus == ZE_RESULT_SUCCESS) &&
         (pcVar7 = (code *)dlsym(pdVar5->handle,"zeGetVirtualMemProcAddrTable"),
         pcVar7 != (code *)0x0)) {
        zVar3 = (*pcVar7)(version,&(pdVar5->dditable).ze.VirtualMem);
        if (zVar3 == ZE_RESULT_SUCCESS) {
          bVar1 = true;
        }
        else {
          pdVar5->initStatus = zVar3;
        }
      }
      __gnu_cxx::
      __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
      ::operator++(&__end1);
    }
    if (bVar1) {
      __range1._4_4_ = ZE_RESULT_SUCCESS;
    }
    else {
      __range1._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
    }
    if (__range1._4_4_ == ZE_RESULT_SUCCESS) {
      sVar4 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                        ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                         (loader::context + 0x15e0));
      if ((sVar4 < 2) && ((*(byte *)(loader::context + 0x1629) & 1) == 0)) {
        pvVar6 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::front
                           ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                            (loader::context + 0x15e0));
        memcpy(pDdiTable,&(pvVar6->dditable).ze.VirtualMem,0x38);
      }
      else {
        pDdiTable->pfnReserve = loader::zeVirtualMemReserve;
        pDdiTable->pfnFree = loader::zeVirtualMemFree;
        pDdiTable->pfnQueryPageSize = loader::zeVirtualMemQueryPageSize;
        pDdiTable->pfnMap = loader::zeVirtualMemMap;
        pDdiTable->pfnUnmap = loader::zeVirtualMemUnmap;
        pDdiTable->pfnSetAccessAttribute = loader::zeVirtualMemSetAccessAttribute;
        pDdiTable->pfnGetAccessAttribute = loader::zeVirtualMemGetAccessAttribute;
      }
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1618) != 0)) {
      pcVar7 = (code *)dlsym(*(undefined8 *)(loader::context + 0x1618),
                             "zeGetVirtualMemProcAddrTable");
      if (pcVar7 == (code *)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      __range1._4_4_ = (*pcVar7)(version,pDdiTable);
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1620) != 0)) {
      pzVar8 = (ze_memory_access_attribute_t *)loader::context;
      dditable.pfnGetAccessAttribute =
           (ze_pfnVirtualMemGetAccessAttribute_t)
           dlsym(*(undefined8 *)(loader::context + 0x1620),"zeGetVirtualMemProcAddrTable");
      if (dditable.pfnGetAccessAttribute == (ze_pfnVirtualMemGetAccessAttribute_t)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      memcpy(local_98,pDdiTable,0x38);
      __range1._4_4_ =
           (*dditable.pfnGetAccessAttribute)
                     ((ze_context_handle_t)(ulong)version,local_98,extraout_RDX,pzVar8,in_R8);
      memcpy((void *)(loader::context + 0x1c48),local_98,0x38);
      if ((*(byte *)(loader::context + 0x1652) & 1) != 0) {
        __range1._4_4_ =
             (*dditable.pfnGetAccessAttribute)
                       ((ze_context_handle_t)(ulong)version,pDdiTable,extraout_RDX_00,pzVar8,in_R8);
      }
    }
    pDdiTable_local._4_4_ = __range1._4_4_;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetVirtualMemProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_virtual_mem_dditable_t* pDdiTable            ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<ze_pfnGetVirtualMemProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zeGetVirtualMemProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.ze.VirtualMem);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnReserve                                  = loader::zeVirtualMemReserve;
            pDdiTable->pfnFree                                     = loader::zeVirtualMemFree;
            pDdiTable->pfnQueryPageSize                            = loader::zeVirtualMemQueryPageSize;
            pDdiTable->pfnMap                                      = loader::zeVirtualMemMap;
            pDdiTable->pfnUnmap                                    = loader::zeVirtualMemUnmap;
            pDdiTable->pfnSetAccessAttribute                       = loader::zeVirtualMemSetAccessAttribute;
            pDdiTable->pfnGetAccessAttribute                       = loader::zeVirtualMemGetAccessAttribute;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.ze.VirtualMem;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetVirtualMemProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zeGetVirtualMemProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    // If the API tracing layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->tracingLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetVirtualMemProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->tracingLayer, "zeGetVirtualMemProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        ze_virtual_mem_dditable_t dditable;
        memcpy(&dditable, pDdiTable, sizeof(ze_virtual_mem_dditable_t));
        result = getTable( version, &dditable );
        loader::context->tracing_dditable.ze.VirtualMem = dditable;
        if ( loader::context->tracingLayerEnabled ) {
            result = getTable( version, pDdiTable );
        }
    }

    return result;
}